

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
                  *this)

{
  QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> *in_RDI;
  
  QByteArray::~QByteArray((QByteArray *)0x110160);
  QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::~QStringBuilder
            (in_RDI);
  return;
}

Assistant:

~QStringBuilder() = default;